

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  RsWeightClauseSyntax *pRVar1;
  DeepCloneVisitor visitor;
  SyntaxNode *local_30;
  Token local_28;
  
  local_28 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_30,
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x30) == (SyntaxNode *)0x0) {
    local_30 = (SyntaxNode *)0x0;
  }
  else {
    local_30 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x30),(DeepCloneVisitor *)&local_30,
                          (BumpAllocator *)__child_stack);
  }
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RsWeightClauseSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::syntax::RsProdSyntax*>
                     ((BumpAllocator *)__child_stack,&local_28,(ExpressionSyntax *)args_1,
                      (RsProdSyntax **)&local_30);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RsWeightClauseSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RsWeightClauseSyntax>(
        node.colonEqual.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.weight, alloc),
        node.codeBlock ? deepClone(*node.codeBlock, alloc) : nullptr
    );
}